

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

void i4mat_print(int m,int n,int *a,string *title)

{
  string local_40;
  string *local_20;
  string *title_local;
  int *a_local;
  int n_local;
  int m_local;
  
  local_20 = title;
  title_local = (string *)a;
  a_local._0_4_ = n;
  a_local._4_4_ = m;
  std::__cxx11::string::string((string *)&local_40,(string *)title);
  i4mat_print_some(m,n,a,1,1,m,n,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void i4mat_print ( int m, int n, int a[], std::string title )

//****************************************************************************80
//
//  Purpose:
//
//    I4MAT_PRINT prints an I4MAT.
//
//  Discussion:
//
//    An I4MAT is an MxN array of I4's, stored by (I,J) -> [I+J*M].
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 September 2009
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, the number of rows in A.
//
//    Input, int N, the number of columns in A.
//
//    Input, int A[M*N], the M by N matrix.
//
//    Input, string TITLE, a title.
//
{
  i4mat_print_some ( m, n, a, 1, 1, m, n, title );

  return;
}